

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef.cpp
# Opt level: O3

void LoadActors(void)

{
  IPair *pIVar1;
  int *piVar2;
  FState *pFVar3;
  bool bVar4;
  Node *pNVar5;
  uint uVar6;
  PClass *pPVar7;
  FState *pFVar8;
  Node *pNVar9;
  PClassActor *pPVar10;
  PClassActor *pPVar11;
  char *pcVar12;
  int iVar13;
  uint uVar14;
  Node *pNVar15;
  ulong uVar16;
  undefined1 *puVar17;
  char *format;
  FScriptPosition *pFVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  timespec ts;
  TMap<FState_*,_bool,_THashTraits<FState_*>,_TValueTraits<bool>_> local_68;
  FName local_44;
  double local_40;
  double local_38;
  
  clock_gettime(1,(timespec *)&local_68);
  local_40 = (double)(long)local_68.Nodes;
  local_38 = (double)(long)local_68.LastFree;
  FScriptPosition::WarnCounter = 0;
  FScriptPosition::ErrorCounter = 0;
  InitThingdef();
  FScriptPosition::StrictErrors = true;
  ParseScripts();
  FScriptPosition::StrictErrors = false;
  ParseAllDecorate();
  FFunctionBuildList::Build(&FunctionBuildList);
  if (0 < FScriptPosition::ErrorCounter) {
    I_Error("%d errors while parsing DECORATE scripts");
  }
  FScriptPosition::WarnCounter = 0;
  FScriptPosition::ErrorCounter = 0;
  uVar21 = (ulong)PClassActor::AllActorClasses.Count;
  if (-1 < (int)(PClassActor::AllActorClasses.Count - 1)) {
    uVar20 = (ulong)(PClassActor::AllActorClasses.Count - 1);
    do {
      pPVar11 = PClassActor::AllActorClasses.Array[uVar20];
      if (*(int *)((long)&(pPVar11->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType
                          .super_PCompoundType.super_PType.super_PTypeBase + 0x24) == -1) {
        pcVar12 = FName::NameData.NameArray
                  [(pPVar11->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.
                   TypeName.Index].Text;
        if ((*(byte *)((long)&(pPVar11->super_PClass).super_PNativeStruct.super_PStruct.
                              super_PNamedType.super_PCompoundType.super_PType.super_PTypeBase +
                      0x21) & 8) == 0) {
          format = "\x1cGClass %s referenced but not defined\n";
          goto LAB_0051807c;
        }
        Printf("\x1cIClass %s referenced but not defined\n");
        FScriptPosition::WarnCounter = FScriptPosition::WarnCounter + 1;
        DObject::StaticPointerSubstitution((DObject *)pPVar11,(DObject *)0x0,false);
        uVar6 = PClassActor::AllActorClasses.Count;
        if ((uVar20 < PClassActor::AllActorClasses.Count) &&
           (uVar6 = PClassActor::AllActorClasses.Count - 1, uVar20 < uVar6)) {
          uVar14 = PClassActor::AllActorClasses.Count - (int)uVar21;
          PClassActor::AllActorClasses.Count = uVar6;
          memmove(PClassActor::AllActorClasses.Array + uVar20,
                  PClassActor::AllActorClasses.Array + uVar21,(ulong)uVar14 << 3);
          uVar6 = PClassActor::AllActorClasses.Count;
        }
      }
      else if ((pPVar11->super_PClass).Defaults == (BYTE *)0x0) {
        pcVar12 = FName::NameData.NameArray
                  [(pPVar11->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.
                   TypeName.Index].Text;
        format = "\x1cGNo ActorInfo defined for class \'%s\'\n";
LAB_0051807c:
        Printf(format,pcVar12);
        FScriptPosition::ErrorCounter = FScriptPosition::ErrorCounter + 1;
        uVar6 = PClassActor::AllActorClasses.Count;
      }
      else {
        local_68.NumUsed = 0;
        TMap<FState_*,_bool,_THashTraits<FState_*>,_TValueTraits<bool>_>::SetNodeVector(&local_68,1)
        ;
        CheckStateLabels(pPVar11,(ENamedName *)CheckStates(PClassActor*)::actorstates,1,
                         "actor sprites");
        iVar13 = 4;
        pPVar10 = pPVar11;
        if ((PClassActor *)AWeapon::RegistrationInfo.MyClass == pPVar11) {
          puVar17 = CheckStates(PClassActor*)::weaponstates;
          pcVar12 = "weapon sprites";
LAB_005180f4:
          CheckStateLabels(pPVar11,(ENamedName *)puVar17,iVar13,pcVar12);
        }
        else {
          do {
            pPVar10 = (PClassActor *)(pPVar10->super_PClass).ParentClass;
            if (pPVar10 == (PClassActor *)AWeapon::RegistrationInfo.MyClass) break;
          } while (pPVar10 != (PClassActor *)0x0);
          puVar17 = CheckStates(PClassActor*)::weaponstates;
          pcVar12 = "weapon sprites";
          if (pPVar10 != (PClassActor *)0x0) goto LAB_005180f4;
          iVar13 = 8;
          pPVar10 = pPVar11;
          if ((PClassActor *)ACustomInventory::RegistrationInfo.MyClass == pPVar11) {
            puVar17 = CheckStates(PClassActor*)::pickupstates;
            pcVar12 = "CustomInventory state chain";
            goto LAB_005180f4;
          }
          do {
            pPVar10 = (PClassActor *)(pPVar10->super_PClass).ParentClass;
            if (pPVar10 == (PClassActor *)ACustomInventory::RegistrationInfo.MyClass) break;
          } while (pPVar10 != (PClassActor *)0x0);
          puVar17 = CheckStates(PClassActor*)::pickupstates;
          pcVar12 = "CustomInventory state chain";
          if (pPVar10 != (PClassActor *)0x0) goto LAB_005180f4;
        }
        iVar13 = pPVar11->NumOwnedStates;
        if (0 < iVar13) {
          uVar16 = 0;
          do {
            pFVar8 = pPVar11->OwnedStates[uVar16].NextState;
            if ((pFVar8 != (FState *)0x0) &&
               (pFVar3 = pPVar11->OwnedStates + uVar16, (pFVar3->UseFlags & ~pFVar8->UseFlags) != 0)
               ) {
              pNVar5 = StateSourceLines.Nodes + (StateSourceLines.Size - 1 & (uint)pFVar3);
              do {
                pNVar15 = pNVar5;
                if ((pNVar15 == (Node *)0x0) || (pNVar15->Next == (Node *)0x1)) {
                  pNVar15 = (Node *)0x0;
                  break;
                }
                pNVar5 = pNVar15->Next;
              } while ((pNVar15->Pair).Key != pFVar3);
              pFVar18 = &(pNVar15->Pair).Value;
              if (pNVar15 == (Node *)0x0) {
                pFVar18 = &unknownstatesource;
              }
              FScriptPosition::Message
                        (pFVar18,2,
                         "\x1cGState %s.%d links to a state with incompatible restrictions.\n",
                         FName::NameData.NameArray
                         [(pPVar11->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType
                          .TypeName.Index].Text,uVar16 & 0xffffffff);
              iVar13 = pPVar11->NumOwnedStates;
            }
            uVar16 = uVar16 + 1;
          } while ((long)uVar16 < (long)iVar13);
        }
        M_Free(local_68.Nodes);
        uVar6 = PClassActor::AllActorClasses.Count;
        if ((pPVar11->super_PClass).bDecorateClass == true) {
          pPVar10 = pPVar11;
          if (pPVar11 != (PClassActor *)AStateProvider::RegistrationInfo.MyClass) {
            do {
              pPVar10 = (PClassActor *)(pPVar10->super_PClass).ParentClass;
              if (pPVar10 == (PClassActor *)AStateProvider::RegistrationInfo.MyClass) break;
            } while (pPVar10 != (PClassActor *)0x0);
            if (pPVar10 == (PClassActor *)0x0) goto LAB_0051826d;
          }
          local_68.NumUsed = 0;
          TMap<FState_*,_bool,_THashTraits<FState_*>,_TValueTraits<bool>_>::SetNodeVector
                    (&local_68,1);
          pPVar10 = pPVar11;
          if ((PClassActor *)AWeapon::RegistrationInfo.MyClass == pPVar11) {
LAB_00518245:
            iVar13 = *(int *)((long)&(pPVar11->super_PClass).super_PNativeStruct.super_PStruct.
                                     super_PNamedType.super_PCompoundType.super_PType.
                                     super_PTypeBase + 0x24);
            puVar17 = (undefined1 *)&CheckForUnsafeStates(PClassActor*)::weaponstates;
            pPVar7 = AWeapon::RegistrationInfo.MyClass;
LAB_00518250:
            if (iVar13 != *(int *)((long)&(pPVar7->super_PNativeStruct).super_PStruct.
                                          super_PNamedType.super_PCompoundType.super_PType.
                                          super_PTypeBase.super_DObject + 0x24)) {
              iVar13 = *(int *)puVar17;
              while (iVar13 != 0) {
                local_44.Index = iVar13;
                pFVar8 = PClassActor::FindState(pPVar11,1,&local_44,false);
                if (pFVar8 != (FState *)0x0) {
                  do {
                    pNVar9 = local_68.Nodes + (local_68.Size - 1 & (uint)pFVar8);
                    while ((pNVar9 != (Node *)0x0 && (pNVar9->Next != (Node *)0x1))) {
                      pIVar1 = &pNVar9->Pair;
                      pNVar9 = pNVar9->Next;
                      if (pIVar1->Key == pFVar8) goto LAB_005183c2;
                    }
                    pNVar9 = TMap<FState_*,_bool,_THashTraits<FState_*>,_TValueTraits<bool>_>::
                             GetNode(&local_68,pFVar8);
                    (pNVar9->Pair).Value = true;
                    if ((pFVar8->ActionFunc != (VMFunction *)0x0) &&
                       ((pFVar8->ActionFunc->super_DObject).field_0x26 == '\x01')) {
                      pPVar10 = FState::StaticFindStateOwner(pFVar8);
                      pNVar5 = StateSourceLines.Nodes + (StateSourceLines.Size - 1 & (uint)pFVar8);
                      do {
                        pNVar15 = pNVar5;
                        if ((pNVar15 == (Node *)0x0) || (pNVar15->Next == (Node *)0x1)) {
                          pNVar15 = (Node *)0x0;
                          break;
                        }
                        pNVar5 = pNVar15->Next;
                      } while ((pNVar15->Pair).Key != pFVar8);
                      pFVar18 = &(pNVar15->Pair).Value;
                      if (pNVar15 == (Node *)0x0) {
                        pFVar18 = &unknownstatesource;
                      }
                      FScriptPosition::Message
                                (pFVar18,2,
                                 "\x1cGUnsafe state call in state %s.%d which accesses user variables, reached by %s.%s.\n"
                                 ,FName::NameData.NameArray
                                  [(pPVar10->super_PClass).super_PNativeStruct.super_PStruct.
                                   super_PNamedType.TypeName.Index].Text,
                                 (ulong)(uint)((int)((ulong)((long)pFVar8 -
                                                            (long)pPVar10->OwnedStates) >> 3) *
                                              -0x33333333),
                                 FName::NameData.NameArray
                                 [(pPVar11->super_PClass).super_PNativeStruct.super_PStruct.
                                  super_PNamedType.TypeName.Index].Text,
                                 FName::NameData.NameArray[iVar13].Text);
                    }
                    pFVar8 = pFVar8->NextState;
                  } while (pFVar8 != (FState *)0x0);
                }
LAB_005183c2:
                piVar2 = (int *)((long)puVar17 + 4);
                puVar17 = (undefined1 *)((long)puVar17 + 4);
                iVar13 = *piVar2;
              }
            }
          }
          else {
            do {
              pPVar10 = (PClassActor *)(pPVar10->super_PClass).ParentClass;
              if (pPVar10 == (PClassActor *)AWeapon::RegistrationInfo.MyClass) break;
            } while (pPVar10 != (PClassActor *)0x0);
            if (pPVar10 != (PClassActor *)0x0) goto LAB_00518245;
            pPVar10 = pPVar11;
            if ((PClassActor *)ACustomInventory::RegistrationInfo.MyClass == pPVar11) {
LAB_005183fb:
              iVar13 = *(int *)((long)&(pPVar11->super_PClass).super_PNativeStruct.super_PStruct.
                                       super_PNamedType.super_PCompoundType.super_PType.
                                       super_PTypeBase + 0x24);
              puVar17 = CheckForUnsafeStates(PClassActor*)::pickupstates;
              pPVar7 = ACustomInventory::RegistrationInfo.MyClass;
              goto LAB_00518250;
            }
            do {
              pPVar10 = (PClassActor *)(pPVar10->super_PClass).ParentClass;
              if (pPVar10 == (PClassActor *)ACustomInventory::RegistrationInfo.MyClass) break;
            } while (pPVar10 != (PClassActor *)0x0);
            if (pPVar10 != (PClassActor *)0x0) goto LAB_005183fb;
          }
          M_Free(local_68.Nodes);
          uVar6 = PClassActor::AllActorClasses.Count;
        }
      }
LAB_0051826d:
      PClassActor::AllActorClasses.Count = uVar6;
      uVar21 = uVar21 - 1;
      bVar4 = 0 < (long)uVar20;
      uVar20 = uVar20 - 1;
    } while (bVar4);
    if (0 < FScriptPosition::ErrorCounter) {
      I_Error("%d errors during actor postprocessing");
    }
  }
  uVar21 = 1;
  clock_gettime(1,(timespec *)&local_68);
  if (batchrun != true) {
    Printf("script parsing took %.2f ms\n",
           ((double)(long)local_68.Nodes + (double)(long)local_68.LastFree * 1e-09 +
           (0.0 - (local_38 * 1e-09 + local_40))) * 1000.0);
  }
  lVar19 = 0;
  do {
    mysnprintf((char *)&local_68,0x14,"QuestItem%d",uVar21);
    pPVar11 = PClass::FindActor((char *)&local_68);
    *(PClassActor **)((long)QuestItemClasses + lVar19) = pPVar11;
    lVar19 = lVar19 + 8;
    uVar21 = (ulong)((int)uVar21 + 1);
  } while (lVar19 != 0xf8);
  TMap<FState_*,_FScriptPosition,_THashTraits<FState_*>,_TValueTraits<FScriptPosition>_>::
  ClearNodeVector(&StateSourceLines);
  TMap<FState_*,_FScriptPosition,_THashTraits<FState_*>,_TValueTraits<FScriptPosition>_>::
  SetNodeVector(&StateSourceLines,1);
  return;
}

Assistant:

void LoadActors()
{
	cycle_t timer;

	timer.Reset(); timer.Clock();
	FScriptPosition::ResetErrorCounter();

	InitThingdef();
	FScriptPosition::StrictErrors = true;
	ParseScripts();

	FScriptPosition::StrictErrors = false;
	ParseAllDecorate();

	FunctionBuildList.Build();

	if (FScriptPosition::ErrorCounter > 0)
	{
		I_Error("%d errors while parsing DECORATE scripts", FScriptPosition::ErrorCounter);
	}
	FScriptPosition::ResetErrorCounter();

	for (int i = PClassActor::AllActorClasses.Size() - 1; i >= 0; i--)
	{
		auto ti = PClassActor::AllActorClasses[i];
		if (ti->Size == TentativeClass)
		{
			if (ti->ObjectFlags & OF_Transient)
			{
				Printf(TEXTCOLOR_ORANGE "Class %s referenced but not defined\n", ti->TypeName.GetChars());
				FScriptPosition::WarnCounter++;
				DObject::StaticPointerSubstitution(ti, nullptr);
				PClassActor::AllActorClasses.Delete(i);
			}
			else
			{
				Printf(TEXTCOLOR_RED "Class %s referenced but not defined\n", ti->TypeName.GetChars());
				FScriptPosition::ErrorCounter++;
			}
			continue;
		}

		if (GetDefaultByType(ti) == nullptr)
		{
			Printf(TEXTCOLOR_RED "No ActorInfo defined for class '%s'\n", ti->TypeName.GetChars());
			FScriptPosition::ErrorCounter++;
			continue;
		}


		CheckStates(ti);

		if (ti->bDecorateClass && ti->IsDescendantOf(RUNTIME_CLASS(AStateProvider)))
		{
			// either a DECORATE based weapon or CustomInventory. 
			// These are subject to relaxed rules for user variables in states.
			// Although there is a runtime check for bogus states, let's do a quick analysis if any of the known entry points
			// hits an unsafe state. If we can find something here it can be handled wuth a compile error rather than a runtime error.
			CheckForUnsafeStates(ti);
		}

	}
	if (FScriptPosition::ErrorCounter > 0)
	{
		I_Error("%d errors during actor postprocessing", FScriptPosition::ErrorCounter);
	}

	timer.Unclock();
	if (!batchrun) Printf("script parsing took %.2f ms\n", timer.TimeMS());

	// Since these are defined in DECORATE now the table has to be initialized here.
	for (int i = 0; i < 31; i++)
	{
		char fmt[20];
		mysnprintf(fmt, countof(fmt), "QuestItem%d", i + 1);
		QuestItemClasses[i] = PClass::FindActor(fmt);
	}
	StateSourceLines.Clear();
}